

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall amrex::StateData::StateData(StateData *this,StateData *rhs)

{
  BoxArray *in_RSI;
  BoxArray *in_RDI;
  
  std::
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ::unique_ptr((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                *)in_RSI,
               (unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                *)in_RDI);
  *(undefined8 *)((long)&(in_RDI->m_bat).m_op + 4) =
       *(undefined8 *)((long)&(in_RSI->m_bat).m_op + 4);
  *(undefined8 *)((long)&(in_RDI->m_bat).m_op + 0xc) =
       *(undefined8 *)((long)&(in_RSI->m_bat).m_op + 0xc);
  *(undefined8 *)((long)&(in_RDI->m_bat).m_op + 0x14) =
       *(undefined8 *)((long)&(in_RSI->m_bat).m_op + 0x14);
  *(undefined8 *)((long)&(in_RDI->m_bat).m_op + 0x1c) =
       *(undefined8 *)((long)&(in_RSI->m_bat).m_op + 0x1c);
  (in_RDI->m_bat).m_op.m_bndryReg.m_hishft.vect[1] =
       (in_RSI->m_bat).m_op.m_bndryReg.m_hishft.vect[1];
  BoxArray::BoxArray(in_RSI,in_RDI);
  DistributionMapping::DistributionMapping
            ((DistributionMapping *)in_RSI,(DistributionMapping *)in_RDI);
  *(undefined8 *)((long)&in_RDI[1].m_bat.m_op + 0x3c) =
       *(undefined8 *)((long)&in_RSI[1].m_bat.m_op + 0x3c);
  in_RDI[1].m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RSI[1].m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  in_RDI[1].m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RSI[1].m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  in_RDI[1].m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RSI[1].m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)in_RSI,
             (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)in_RDI);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)in_RSI,
             (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)in_RDI);
  *(undefined8 *)((long)&in_RDI[2].m_bat.m_op + 4) =
       *(undefined8 *)((long)&in_RSI[2].m_bat.m_op + 4);
  return;
}

Assistant:

StateData::StateData (StateData&& rhs) noexcept
    : m_factory(std::move(rhs.m_factory)),
      desc(rhs.desc),
      domain(rhs.domain),
      grids(std::move(rhs.grids)),
      dmap(std::move(rhs.dmap)),
      new_time(rhs.new_time),
      old_time(rhs.old_time),
      new_data(std::move(rhs.new_data)),
      old_data(std::move(rhs.old_data)),
      arena(rhs.arena)
{
}